

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
InterpreterTest_SqrtF64_Test::~InterpreterTest_SqrtF64_Test(InterpreterTest_SqrtF64_Test *this)

{
  InterpreterTest_SqrtF64_Test *this_local;
  
  ~InterpreterTest_SqrtF64_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(InterpreterTest, SqrtF64) {
  Module wasm;
  IRBuilder builder(wasm);

  ASSERT_FALSE(builder.makeConst(Literal(double(5.0))).getErr());
  ASSERT_FALSE(builder.makeUnary(SqrtFloat64).getErr());

  auto expr = builder.build();
  ASSERT_FALSE(expr.getErr());

  auto results = Interpreter{}.runTest(*expr);
  std::vector<Literal> expected{Literal(double(2.23606797749979))};

  EXPECT_EQ(results, expected);
}